

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O2

void __thiscall jaegertracing::Span::SetOperationName(Span *this,string_view name)

{
  string_view local_48;
  string local_38;
  
  local_48.length_ = name.length_;
  local_48.data_ = name.data_;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x148))->__data);
  if (*(long *)(this + 0xf8) == 0) {
    opentracing::v3::string_view::operator_cast_to_string(&local_38,&local_48);
    std::__cxx11::string::operator=((string *)(this + 200),(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x148));
  return;
}

Assistant:

void SetOperationName(opentracing::string_view name) noexcept override
    {
        std::lock_guard<std::mutex> lock(_mutex);
        if (isFinished()) {
            return;
        }
        _operationName = name;
    }